

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::find
          (iterator *__return_storage_ptr__,setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,
          key_type_conflict *k)

{
  bool bVar1;
  less<int> local_2b [2];
  less<int> local_29;
  node *local_28;
  node *node;
  key_type_conflict *k_local;
  setBase<int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  node = (node *)k;
  k_local = (key_type_conflict *)this;
  this_local = (setBase<int,_ft::less<int>,_ft::allocator<int>_> *)__return_storage_ptr__;
  local_28 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::root
                       (&this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
  while( true ) {
    bVar1 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::validNode
                      (&this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>,
                       local_28);
    if (!bVar1) {
      treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
                (__return_storage_ptr__,
                 &this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
      return __return_storage_ptr__;
    }
    bVar1 = equal(this,&local_28->value,&node->value);
    if (bVar1) break;
    key_comp(this);
    bVar1 = less<int>::operator()(&local_29,&local_28->value,&node->value);
    if (bVar1) {
      local_28 = local_28->right;
    }
    else {
      key_comp(this);
      bVar1 = less<int>::operator()(local_2b,&node->value,&local_28->value);
      if (bVar1) {
        local_28 = local_28->left;
      }
    }
  }
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
            (__return_storage_ptr__,
             &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree,
             local_28);
  return __return_storage_ptr__;
}

Assistant:

iterator		find(key_type const & k)
	{
		node*	node(this->root());
		while (this->validNode(node))
		{
			if (this->equal(node->value, k)) return iterator(this->m_tree, node);
			else if (this->key_comp()(node->value, k)) node = node->right;
			else if (this->key_comp()(k, node->value)) node = node->left;
		}
		return this->end();
	}